

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::WriteCommonCodeRules(cmMakefileTargetGenerator *this)

{
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  cmLocalUnixMakefileGenerator3 *this_02;
  bool bVar1;
  Encoding EVar2;
  type pcVar3;
  ostream *poVar4;
  reference ppcVar5;
  cmCustomCommand *this_03;
  ulong uVar6;
  string *psVar7;
  pointer this_04;
  bool local_f2c;
  bool local_f2a;
  string local_ea0;
  string local_e80;
  uint local_e5c;
  int local_e58;
  undefined1 local_e51;
  undefined1 local_e50 [56];
  cmAlphaNum local_e18;
  string local_de8;
  string local_dc8;
  string local_da8;
  undefined1 local_d88 [8];
  cmGeneratedFileStream depFileStream_1;
  cmAlphaNum local_b18;
  cmAlphaNum local_ae8;
  string local_ab8;
  undefined1 local_a98 [8];
  cmGeneratedFileStream legacyDepFileStream;
  cmGeneratedFileStream timestampFileStream;
  cmAlphaNum local_598;
  undefined1 local_568 [8];
  string compilerDependTimestamp;
  cmAlphaNum local_540;
  cmAlphaNum local_510;
  string local_4e0;
  undefined1 local_4c0 [8];
  cmGeneratedFileStream depFileStream;
  string local_238;
  cmAlphaNum local_218;
  cmAlphaNum local_1e8;
  undefined1 local_1b8 [8];
  string compilerDependFile;
  undefined1 local_190 [6];
  bool compilerGenerateDeps;
  string depsUseCompiler;
  cmSourceFile *sf;
  iterator __end1;
  iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  undefined1 local_130 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  undefined1 local_110 [7];
  bool ccGenerateDeps;
  string local_f0;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  undefined1 local_70 [8];
  string dependFileNameFull;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *root;
  cmMakefileTargetGenerator *this_local;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  root = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_MAKE_INCLUDE_FROM_ROOT",&local_39);
  bVar1 = cmMakefile::IsOn(this_00,&local_38);
  local_18 = "";
  if (bVar1) {
    local_18 = "$(CMAKE_BINARY_DIR)/";
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  cmAlphaNum::cmAlphaNum(&local_a0,&this->TargetBuildDirectoryFull);
  cmAlphaNum::cmAlphaNum(&local_d0,"/depend.make");
  cmStrCat<>((string *)local_70,&local_a0,&local_d0);
  pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*(&this->BuildFileStream);
  poVar4 = std::operator<<((ostream *)pcVar3,
                           "# Include any dependencies generated for this target.\n");
  poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,local_18);
  cmOutputConverter::MaybeRelativeToTopBinDir
            ((string *)local_110,
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,(string *)local_70);
  cmSystemTools::ConvertToOutputPath(&local_f0,(string *)local_110);
  poVar4 = std::operator<<(poVar4,(string *)&local_f0);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)local_110);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_130);
  this_01 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&__range1,this);
  cmGeneratorTarget::GetCustomCommands
            (this_01,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                     local_130,(string *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      local_130);
  sf = (cmSourceFile *)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                 ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_130);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                *)&sf);
    if (!bVar1) {
LAB_00703852:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_190,"CMAKE_DEPENDS_USE_COMPILER",
                 (allocator<char> *)(compilerDependFile.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(compilerDependFile.field_2._M_local_buf + 0xf));
      bVar1 = cmGlobalUnixMakefileGenerator3::SupportsCompilerDependencies(this->GlobalGenerator);
      local_f2a = false;
      if (bVar1) {
        bVar1 = cmMakefile::IsDefinitionSet
                          ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_190);
        local_f2c = true;
        if (bVar1) {
          local_f2c = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,
                                       (string *)local_190);
        }
        local_f2a = local_f2c;
      }
      compilerDependFile.field_2._M_local_buf[0xe] = local_f2a;
      if ((local_f2a != false) ||
         ((customCommands.
           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0)) {
        cmAlphaNum::cmAlphaNum(&local_1e8,&this->TargetBuildDirectoryFull);
        cmAlphaNum::cmAlphaNum(&local_218,"/compiler_depend.make");
        cmStrCat<>((string *)local_1b8,&local_1e8,&local_218);
        pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ::operator*(&this->BuildFileStream);
        poVar4 = std::operator<<((ostream *)pcVar3,
                                 "# Include any dependencies generated by the compiler for this target.\n"
                                );
        poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,local_18);
        cmOutputConverter::MaybeRelativeToTopBinDir
                  ((string *)&depFileStream.field_0x260,
                   &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)local_1b8);
        cmSystemTools::ConvertToOutputPath(&local_238,(string *)&depFileStream.field_0x260);
        poVar4 = std::operator<<(poVar4,(string *)&local_238);
        std::operator<<(poVar4,"\n\n");
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&depFileStream.field_0x260);
        EVar2 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[5])();
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_4c0,(string *)local_1b8,false,EVar2);
        poVar4 = std::operator<<((ostream *)local_4c0,
                                 "# Empty compiler generated dependencies file for ");
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((this->super_cmCommonTargetGenerator).GeneratorTarget);
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4,".\n");
        std::operator<<(poVar4,"# This may be replaced when dependencies are built.\n");
        cmAlphaNum::cmAlphaNum(&local_510,&this->TargetBuildDirectoryFull);
        cmAlphaNum::cmAlphaNum(&local_540,"/compiler_depend.internal");
        cmStrCat<>(&local_4e0,&local_510,&local_540);
        compilerDependTimestamp.field_2._8_8_ = cmsys::SystemTools::RemoveFile(&local_4e0);
        std::__cxx11::string::~string((string *)&local_4e0);
        cmAlphaNum::cmAlphaNum(&local_598,&this->TargetBuildDirectoryFull);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&timestampFileStream.field_0x260,"/compiler_depend.ts")
        ;
        cmStrCat<>((string *)local_568,&local_598,(cmAlphaNum *)&timestampFileStream.field_0x260);
        bVar1 = cmsys::SystemTools::FileExists((string *)local_568);
        if (!bVar1) {
          EVar2 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[5])();
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&legacyDepFileStream.field_0x260,(string *)local_568,
                     false,EVar2);
          poVar4 = std::operator<<((ostream *)&legacyDepFileStream.field_0x260,
                                   "# CMAKE generated file: DO NOT EDIT!\n");
          poVar4 = std::operator<<(poVar4,
                                   "# Timestamp file for compiler generated dependencies management for "
                                  );
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                             ((this->super_cmCommonTargetGenerator).GeneratorTarget);
          poVar4 = std::operator<<(poVar4,(string *)psVar7);
          std::operator<<(poVar4,".\n");
          cmGeneratedFileStream::~cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&legacyDepFileStream.field_0x260);
        }
        std::__cxx11::string::~string((string *)local_568);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
        std::__cxx11::string::~string((string *)local_1b8);
      }
      if ((compilerDependFile.field_2._M_local_buf[0xe] & 1U) == 0) {
        bVar1 = cmsys::SystemTools::FileExists((string *)local_70);
        if (!bVar1) {
          EVar2 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[5])();
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)local_d88,(string *)local_70,false,EVar2);
          poVar4 = std::operator<<((ostream *)local_d88,"# Empty dependencies file for ");
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                             ((this->super_cmCommonTargetGenerator).GeneratorTarget);
          poVar4 = std::operator<<(poVar4,(string *)psVar7);
          poVar4 = std::operator<<(poVar4,".\n");
          std::operator<<(poVar4,"# This may be replaced when dependencies are built.\n");
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_d88);
        }
      }
      else {
        EVar2 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[5])();
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_a98,(string *)local_70,false,EVar2);
        poVar4 = std::operator<<((ostream *)local_a98,"# Empty dependencies file for ");
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((this->super_cmCommonTargetGenerator).GeneratorTarget);
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4,".\n");
        std::operator<<(poVar4,"# This may be replaced when dependencies are built.\n");
        cmAlphaNum::cmAlphaNum(&local_ae8,&this->TargetBuildDirectoryFull);
        cmAlphaNum::cmAlphaNum(&local_b18,"/depend.internal");
        cmStrCat<>(&local_ab8,&local_ae8,&local_b18);
        depFileStream_1._608_8_ = cmsys::SystemTools::RemoveFile(&local_ab8);
        std::__cxx11::string::~string((string *)&local_ab8);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_a98);
      }
      if ((this->NoRuleMessages & 1U) == 0) {
        pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ::operator*(&this->BuildFileStream);
        poVar4 = std::operator<<((ostream *)pcVar3,
                                 "# Include the progress variables for this target.\n");
        poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,local_18);
        cmOutputConverter::MaybeRelativeToTopBinDir
                  (&local_dc8,
                   &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&this->ProgressFileNameFull);
        cmSystemTools::ConvertToOutputPath(&local_da8,&local_dc8);
        poVar4 = std::operator<<(poVar4,(string *)&local_da8);
        std::operator<<(poVar4,"\n\n");
        std::__cxx11::string::~string((string *)&local_da8);
        std::__cxx11::string::~string((string *)&local_dc8);
      }
      cmAlphaNum::cmAlphaNum(&local_e18,&this->TargetBuildDirectoryFull);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_e50 + 8),"/flags.make");
      cmStrCat<>(&local_de8,&local_e18,(cmAlphaNum *)(local_e50 + 8));
      std::__cxx11::string::operator=((string *)&this->FlagFileNameFull,(string *)&local_de8);
      std::__cxx11::string::~string((string *)&local_de8);
      local_e51 = None;
      local_e58 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[5])();
      std::make_unique<cmGeneratedFileStream,std::__cxx11::string&,bool,codecvt::Encoding>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e50,
                 (bool *)&this->FlagFileNameFull,(Encoding *)&local_e51);
      std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::operator=
                (&this->FlagFileStream,
                 (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
                 local_e50);
      std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
      ~unique_ptr((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
                  local_e50);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->FlagFileStream);
      if (bVar1) {
        this_04 = std::
                  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
                  operator->(&this->FlagFileStream);
        cmGeneratedFileStream::SetCopyIfDifferent(this_04,true);
        this_02 = this->LocalGenerator;
        pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ::operator*(&this->FlagFileStream);
        cmLocalUnixMakefileGenerator3::WriteDisclaimer(this_02,(ostream *)pcVar3);
        pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ::operator*(&this->BuildFileStream);
        poVar4 = std::operator<<((ostream *)pcVar3,
                                 "# Include the compile flags for this target\'s objects.\n");
        poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,local_18);
        cmOutputConverter::MaybeRelativeToTopBinDir
                  (&local_ea0,
                   &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&this->FlagFileNameFull);
        cmSystemTools::ConvertToOutputPath(&local_e80,&local_ea0);
        poVar4 = std::operator<<(poVar4,(string *)&local_e80);
        std::operator<<(poVar4,"\n\n");
        std::__cxx11::string::~string((string *)&local_e80);
        std::__cxx11::string::~string((string *)&local_ea0);
      }
      local_e5c = (uint)!bVar1;
      std::__cxx11::string::~string((string *)local_190);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_130);
      std::__cxx11::string::~string((string *)local_70);
      return;
    }
    ppcVar5 = __gnu_cxx::
              __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator*(&__end1);
    depsUseCompiler.field_2._8_8_ = *ppcVar5;
    this_03 = cmSourceFile::GetCustomCommand((cmSourceFile *)depsUseCompiler.field_2._8_8_);
    cmCustomCommand::GetDepfile_abi_cxx11_(this_03);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      goto LAB_00703852;
    }
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmMakefileTargetGenerator::WriteCommonCodeRules()
{
  const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")
                        ? "$(CMAKE_BINARY_DIR)/"
                        : "");

  // Include the dependencies for the target.
  std::string dependFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, "/depend.make");
  *this->BuildFileStream
    << "# Include any dependencies generated for this target.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator->MaybeRelativeToTopBinDir(dependFileNameFull))
    << "\n";

  // Scan any custom commands to check if DEPFILE option is specified
  bool ccGenerateDeps = false;
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands,
                                           this->GetConfigName());
  for (cmSourceFile const* sf : customCommands) {
    if (!sf->GetCustomCommand()->GetDepfile().empty()) {
      ccGenerateDeps = true;
      break;
    }
  }

  std::string depsUseCompiler = "CMAKE_DEPENDS_USE_COMPILER";
  bool compilerGenerateDeps =
    this->GlobalGenerator->SupportsCompilerDependencies() &&
    (!this->Makefile->IsDefinitionSet(depsUseCompiler) ||
     this->Makefile->IsOn(depsUseCompiler));

  if (compilerGenerateDeps || ccGenerateDeps) {
    std::string compilerDependFile =
      cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.make");
    *this->BuildFileStream << "# Include any dependencies generated by the "
                              "compiler for this target.\n"
                           << this->GlobalGenerator->IncludeDirective << " "
                           << root
                           << cmSystemTools::ConvertToOutputPath(
                                this->LocalGenerator->MaybeRelativeToTopBinDir(
                                  compilerDependFile))
                           << "\n\n";

    // Write an empty dependency file.
    cmGeneratedFileStream depFileStream(
      compilerDependFile, false, this->GlobalGenerator->GetMakefileEncoding());
    depFileStream << "# Empty compiler generated dependencies file for "
                  << this->GeneratorTarget->GetName() << ".\n"
                  << "# This may be replaced when dependencies are built.\n";
    // remove internal dependency file
    cmSystemTools::RemoveFile(
      cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.internal"));

    std::string compilerDependTimestamp =
      cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.ts");
    if (!cmSystemTools::FileExists(compilerDependTimestamp)) {
      // Write a dependency timestamp file.
      cmGeneratedFileStream timestampFileStream(
        compilerDependTimestamp, false,
        this->GlobalGenerator->GetMakefileEncoding());
      timestampFileStream
        << "# CMAKE generated file: DO NOT EDIT!\n"
        << "# Timestamp file for compiler generated dependencies "
           "management for "
        << this->GeneratorTarget->GetName() << ".\n";
    }
  }

  if (compilerGenerateDeps) {
    // deactivate no longer needed legacy dependency files
    // Write an empty dependency file.
    cmGeneratedFileStream legacyDepFileStream(
      dependFileNameFull, false, this->GlobalGenerator->GetMakefileEncoding());
    legacyDepFileStream
      << "# Empty dependencies file for " << this->GeneratorTarget->GetName()
      << ".\n"
      << "# This may be replaced when dependencies are built.\n";
    // remove internal dependency file
    cmSystemTools::RemoveFile(
      cmStrCat(this->TargetBuildDirectoryFull, "/depend.internal"));
  } else {
    // make sure the depend file exists
    if (!cmSystemTools::FileExists(dependFileNameFull)) {
      // Write an empty dependency file.
      cmGeneratedFileStream depFileStream(
        dependFileNameFull, false,
        this->GlobalGenerator->GetMakefileEncoding());
      depFileStream << "# Empty dependencies file for "
                    << this->GeneratorTarget->GetName() << ".\n"
                    << "# This may be replaced when dependencies are built.\n";
    }
  }

  if (!this->NoRuleMessages) {
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator->MaybeRelativeToTopBinDir(
             this->ProgressFileNameFull))
      << "\n\n";
  }

  // Open the flags file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->FlagFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, "/flags.make");
  this->FlagFileStream = cm::make_unique<cmGeneratedFileStream>(
    this->FlagFileNameFull, false,
    this->GlobalGenerator->GetMakefileEncoding());
  if (!this->FlagFileStream) {
    return;
  }
  this->FlagFileStream->SetCopyIfDifferent(true);
  this->LocalGenerator->WriteDisclaimer(*this->FlagFileStream);

  // Include the flags for the target.
  *this->BuildFileStream
    << "# Include the compile flags for this target's objects.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator->MaybeRelativeToTopBinDir(
           this->FlagFileNameFull))
    << "\n\n";
}